

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

uint capnp::compiler::anon_unknown_0::getOrdinal(Field field)

{
  Field field_00;
  uint uVar1;
  undefined1 in_stack_00000000 [40];
  void *in_stack_00000028;
  WirePointer *in_stack_00000030;
  uint in_stack_00000038;
  undefined4 in_stack_0000003c;
  StructSchema group;
  Fault f;
  Schema local_90;
  Type local_88;
  Field local_50;
  
  if (in_stack_00000038 < 0x60) {
    if (in_stack_00000038 < 0x50) goto LAB_0016c1e8;
  }
  else if (*(short *)((long)in_stack_00000028 + 10) == 1) {
    if (in_stack_00000038 < 0x70) {
      return 0;
    }
    return (uint)*(ushort *)((long)in_stack_00000028 + 0xc);
  }
  if (*(short *)((long)in_stack_00000028 + 8) == 1) {
    local_88 = StructSchema::Field::getType((Field *)&stack0x00000008);
    local_90.raw = (RawBrandedSchema *)Type::asStruct(&local_88);
    StructSchema::getFields((FieldList *)&local_88,(StructSchema *)&local_90);
    StructSchema::FieldList::operator[](&local_50,(FieldList *)&local_88,0);
    field_00.proto._reader.pointers = (WirePointer *)in_stack_00000028;
    field_00.parent.super_Schema.raw = (Schema)(Schema)in_stack_00000000._0_8_;
    field_00.index = in_stack_00000000._8_4_;
    field_00._12_4_ = in_stack_00000000._12_4_;
    field_00.proto._reader.segment = (SegmentReader *)in_stack_00000000._16_8_;
    field_00.proto._reader.capTable = (CapTableReader *)in_stack_00000000._24_8_;
    field_00.proto._reader.data = (void *)in_stack_00000000._32_8_;
    field_00.proto._reader._32_8_ = in_stack_00000030;
    field_00.proto._reader.nestingLimit = in_stack_00000038;
    field_00.proto._reader._44_2_ = (StructPointerCount)in_stack_0000003c;
    field_00.proto._reader._46_2_ = SUB42(in_stack_0000003c,2);
    uVar1 = getOrdinal(field_00);
    return uVar1;
  }
LAB_0016c1e8:
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
             ,0x1ce,FAILED,"proto.isGroup()","");
  kj::_::Debug::Fault::fatal((Fault *)&local_88);
}

Assistant:

static ChangeInfo structPermuteFields(
    Declaration::Builder decl, uint& nextOrdinal, bool scopeHasUnion) {
  if (decl.getNestedDecls().size() == 0) {
    return { NO_CHANGE, "Permute field code order, but there were none." };
  }

  auto oldOrphan = decl.disownNestedDecls();
  auto old = oldOrphan.get();

  KJ_STACK_ARRAY(uint, mapping, old.size(), 16, 64);

  for (uint i = 0; i < mapping.size(); i++) {
    mapping[i] = i;
  }
  for (uint i = mapping.size() - 1; i > 0; i--) {
    uint j = rand() % i;
    uint temp = mapping[j];
    mapping[j] = mapping[i];
    mapping[i] = temp;
  }

  auto newNested = decl.initNestedDecls(old.size());
  for (uint i = 0; i < old.size(); i++) {
    newNested.setWithCaveats(i, old[mapping[i]]);
  }

  return { COMPATIBLE, "Permute field code order." };
}